

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFun.cpp
# Opt level: O0

double Imath_2_5::succd(double d)

{
  anon_union_8_2_94730066 u;
  double d_local;
  
  u.d = d;
  if (((ulong)d & 0x7ff0000000000000) != 0x7ff0000000000000) {
    if ((d == 0.0) || (d == -0.0)) {
      u.d = 4.94065645841247e-324;
    }
    else if (d <= 0.0) {
      u.d = d - 1;
    }
    else {
      u.d = d + 1;
    }
  }
  return u.d;
}

Assistant:

double
succd (double d)
{
    union {double d; Int64 i;} u;
    u.d = d;

    if ((u.i & 0x7ff0000000000000LL) == 0x7ff0000000000000LL)
    {
        // Nan or infinity; don't change value.
    }
    else if (u.i == 0x0000000000000000LL || u.i == 0x8000000000000000LL)
    {
        // Plus or minus zero.

        u.i = 0x0000000000000001LL;
    }
    else if (u.d > 0)
    {
        // Positive double, normalized or denormalized.
        // Incrementing the largest positive double
        // produces +infinity.

        ++u.i;
    }
    else
    {
        // Negative normalized or denormalized double.

        --u.i;
    }

    return u.d;
}